

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tcerr.cpp
# Opt level: O3

char * tcerr_get_msg(int msgnum,int verbose)

{
  char *pcVar1;
  
  pcVar1 = err_get_msg(tc_messages,tc_message_count,msgnum,verbose);
  if (pcVar1 != (char *)0x0) {
    return pcVar1;
  }
  pcVar1 = err_get_msg(vm_messages,vm_message_count,msgnum,verbose);
  return pcVar1;
}

Assistant:

const char *tcerr_get_msg(int msgnum, int verbose)
{
    const char *msg;
    
    /* look up the message in the compiler message array */
    msg = err_get_msg(tc_messages, tc_message_count,
                      msgnum, verbose);
    if (msg != 0)
        return msg;

    /* look up the message in the interpreter message array */
    msg = err_get_msg(vm_messages, vm_message_count,
                      msgnum, verbose);
    if (msg != 0)
        return msg;

    /* there's nowhere else to look - return failiure */
    return 0;
}